

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent *indent,string *toDestDirPath)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80 [8];
  string ranlib;
  allocator local_49;
  string local_48;
  string *local_28;
  string *toDestDirPath_local;
  Indent *indent_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  
  local_28 = toDestDirPath;
  toDestDirPath_local = (string *)indent;
  indent_local = (Indent *)os;
  os_local = (ostream *)this;
  TVar2 = cmTarget::GetType(this->Target);
  if (TVar2 == STATIC_LIBRARY) {
    pcVar3 = cmTarget::GetMakefile(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"APPLE",&local_49);
    bVar1 = cmMakefile::IsOn(pcVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pcVar3 = cmTarget::GetMakefile(this->Target);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"CMAKE_RANLIB",&local_a1);
      pcVar4 = cmMakefile::GetRequiredDefinition(pcVar3,&local_a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,pcVar4,&local_a2);
      std::allocator<char>::~allocator((allocator<char> *)&local_a2);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        poVar6 = ::operator<<((ostream *)indent_local,(cmScriptGeneratorIndent *)toDestDirPath_local
                             );
        poVar6 = std::operator<<(poVar6,"execute_process(COMMAND \"");
        poVar6 = std::operator<<(poVar6,local_80);
        poVar6 = std::operator<<(poVar6,"\" \"");
        poVar6 = std::operator<<(poVar6,(string *)local_28);
        std::operator<<(poVar6,"\")\n");
      }
      std::__cxx11::string::~string(local_80);
    }
  }
  return;
}

Assistant:

void
cmInstallTargetGenerator::AddRanlibRule(std::ostream& os,
                                        Indent const& indent,
                                        const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if(this->Target->GetType() != cmTarget::STATIC_LIBRARY)
    {
    return;
    }

  // Perform post-installation processing on the file depending
  // on its type.
  if(!this->Target->GetMakefile()->IsOn("APPLE"))
    {
    return;
    }

  std::string ranlib =
    this->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if(ranlib.empty())
    {
    return;
    }

  os << indent << "execute_process(COMMAND \""
     << ranlib << "\" \"" << toDestDirPath << "\")\n";
}